

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall IteratorTest::indexTest<true>(IteratorTest *this)

{
  int i;
  long lVar1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  iterator local_b0;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_b0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_b0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_b0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    local_b0.view_._0_1_ = it.index_ == (long)(this->data_[lVar1] / 2);
    test((bool *)&local_b0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_b0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_b0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_b0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    local_b0.view_._0_1_ = it.index_ == (long)(this->data_[lVar1] / 2);
    test((bool *)&local_b0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  *shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_b0,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_b0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_b0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_c8);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    local_b0.view_._0_1_ = it.index_ == (long)(this->data_[lVar1] / 2);
    test((bool *)&local_b0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void IteratorTest::indexTest() {
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.index()== static_cast<std::size_t>(data_[i]/2));
            ++it;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.index()== static_cast<std::size_t>(data_[i]/2));
            ++it;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.index()== static_cast<std::size_t>(data_[i]/2));
            ++it;
        }
    }
}